

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O3

float128 float128_rem_x86_64(float128 a,float128 b,float_status *status)

{
  uint uVar1;
  ulong uVar2;
  byte bVar3;
  char cVar4;
  ulong uVar5;
  uint64_t zSig1;
  long lVar6;
  long lVar7;
  uint64_t zSig0;
  ulong uVar8;
  ulong uVar9;
  uint32_t aLow;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  uint32_t bLow;
  ulong uVar13;
  uint64_t uVar14;
  ulong uVar15;
  uint32_t aLow_1;
  uint uVar16;
  int iVar17;
  ulong uVar18;
  bool bVar19;
  bool bVar20;
  bool bVar21;
  bool bVar22;
  int32_t bExp;
  int32_t aExp;
  uint local_ac;
  ulong local_a8;
  ulong local_a0;
  uint local_98;
  uint local_94;
  ulong local_90;
  float_status *local_88;
  ulong local_80;
  uint64_t local_78;
  ulong local_70;
  uint64_t local_68;
  ulong local_60;
  ulong local_58;
  ulong local_50;
  ulong local_48;
  ulong local_40;
  ulong local_38;
  
  local_78 = b.low;
  uVar14 = a.low;
  uVar15 = a.high & 0xffffffffffff;
  uVar16 = a.high._6_2_ & 0x7fff;
  local_70 = b.high & 0xffffffffffff;
  local_ac = b.high._6_2_ & 0x7fff;
  local_94 = uVar16;
  local_68 = uVar14;
  local_60 = uVar15;
  if (uVar16 == 0x7fff) {
    if ((((undefined1  [16])a & (undefined1  [16])0xffffffffffff) == (undefined1  [16])0x0 &&
         uVar14 == 0) &&
       (((undefined1  [16])b & (undefined1  [16])0xffffffffffff) == (undefined1  [16])0x0 &&
        local_78 == 0 || local_ac != 0x7fff)) {
LAB_004e582f:
      status->float_exception_flags = status->float_exception_flags | 1;
      return (float128)(ZEXT816(0xffff800000000000) << 0x40);
    }
LAB_004e54f6:
    a = propagateFloat128NaN(a,b,status);
  }
  else {
    if (((undefined1  [16])b & (undefined1  [16])0x7fff000000000000) == (undefined1  [16])0x0) {
      if (((undefined1  [16])b & (undefined1  [16])0xffffffffffff) == (undefined1  [16])0x0 &&
          local_78 == 0) goto LAB_004e582f;
      normalizeFloat128Subnormal(local_70,local_78,(int32_t *)&local_ac,&local_70,&local_78);
    }
    else if (local_ac == 0x7fff) {
      if (((undefined1  [16])b & (undefined1  [16])0xffffffffffff) == (undefined1  [16])0x0 &&
          local_78 == 0) {
        return a;
      }
      goto LAB_004e54f6;
    }
    if (((undefined1  [16])a & (undefined1  [16])0x7fff000000000000) == (undefined1  [16])0x0) {
      if (((undefined1  [16])a & (undefined1  [16])0xffffffffffff) == (undefined1  [16])0x0 &&
          uVar14 == 0) {
        return a;
      }
      normalizeFloat128Subnormal(uVar15,uVar14,(int32_t *)&local_94,&local_60,&local_68);
      uVar16 = local_94;
    }
    iVar17 = uVar16 - local_ac;
    if (-2 < iVar17) {
      bVar3 = iVar17 == -1 ^ 0xf;
      uVar8 = local_68 << bVar3;
      uVar11 = local_68 >> ((iVar17 == -1) + 0x31U & 0x3f) | (local_60 | 0x1000000000000) << bVar3;
      uVar10 = local_78 * 0x8000;
      uVar13 = local_70 << 0xf;
      local_a8 = uVar13 | 0x8000000000000000;
      local_90 = local_78 >> 0x31;
      uVar15 = local_90 + local_a8;
      bVar19 = uVar15 <= uVar11;
      bVar22 = uVar11 == uVar15;
      bVar20 = uVar10 <= uVar8;
      if (bVar20 && bVar22 || bVar19 && !bVar22) {
        bVar21 = uVar8 < uVar10;
        uVar8 = uVar8 + local_78 * -0x8000;
        uVar11 = (uVar11 - uVar15) - (ulong)bVar21;
      }
      local_98 = local_ac;
      uVar16 = iVar17 - 0x40;
      if (iVar17 < 0x41) {
        uVar5 = (ulong)(bVar20 && bVar22 || bVar19 && !bVar22);
      }
      else {
        uVar12 = local_a8 >> 0x20;
        local_50 = uVar13 & 0xffffffff00000000 | 0x8000000000000000;
        local_80 = uVar15 & 0xffffffff;
        local_40 = uVar10 >> 0x20;
        local_48 = uVar10 & 0xffffffff;
        uVar1 = uVar16;
        do {
          local_38 = uVar8;
          local_a0 = (ulong)uVar1;
          uVar8 = 0xffffffffffffffff;
          if (uVar11 < uVar15) {
            uVar5 = 0xffffffff00000000;
            if (uVar11 < local_50) {
              uVar5 = uVar11 / uVar12 << 0x20;
            }
            uVar2 = (uVar5 >> 0x20) * local_80;
            uVar18 = uVar5 * uVar15;
            uVar8 = local_38 - uVar18;
            lVar6 = ((uVar11 - ((uVar2 >> 0x20) + uVar12 * (uVar5 >> 0x20))) -
                    (ulong)(local_38 < uVar18)) - (ulong)(uVar18 < uVar2 << 0x20);
            if (lVar6 < 0) {
              uVar2 = (0x100000000 - uVar5) * uVar15 + local_38;
              uVar18 = uVar8;
              do {
                uVar5 = uVar5 - 0x100000000;
                uVar8 = uVar18 + (uVar15 << 0x20);
                bVar19 = uVar2 < uVar18;
                uVar2 = uVar2 + (uVar15 << 0x20);
                lVar6 = lVar6 + uVar12 + (ulong)bVar19;
                uVar18 = uVar8;
              } while (lVar6 < 0);
            }
            uVar8 = uVar8 >> 0x20 | lVar6 << 0x20;
            if (uVar8 < local_50) {
              uVar8 = uVar8 / uVar12;
            }
            else {
              uVar8 = 0xffffffff;
            }
            uVar8 = uVar8 | uVar5;
          }
          uVar5 = uVar8 - 4;
          if (uVar8 < 4) {
            uVar5 = 0;
          }
          uVar8 = uVar5 >> 0x20;
          uVar2 = (uVar5 & 0xffffffff) * local_40;
          uVar18 = uVar2 + uVar8 * local_48;
          lVar6 = 0;
          if (CARRY8(uVar2,uVar8 * local_48)) {
            lVar6 = 0x100000000;
          }
          lVar7 = (uVar5 & 0xffffffff) * uVar12 + uVar8 * local_80;
          uVar2 = uVar5 * uVar15;
          uVar18 = uVar8 * local_40 + uVar2 + (uVar18 >> 0x20) + lVar6 +
                   (ulong)(uVar5 * uVar10 < uVar18 << 0x20);
          uVar9 = uVar18 << 0x3d | uVar5 * uVar10 >> 3;
          uVar8 = -uVar9;
          uVar11 = ((uVar11 << 0x3d | local_38 >> 3) - (ulong)(uVar9 != 0)) -
                   ((ulong)((uint)(uVar18 < uVar2) +
                           (uint)(uVar2 < (ulong)(lVar7 << 0x20)) +
                           (int)((ulong)lVar7 >> 0x20) +
                           (int)(local_a8 >> 0x20) * (int)(uVar5 >> 0x20)) << 0x3d | uVar18 >> 3);
          uVar16 = uVar1 - 0x3d;
          bVar19 = 0x3d < (int)uVar1;
          uVar1 = uVar16;
        } while (bVar19);
      }
      if ((int)uVar16 < -0x3f) {
        uVar14 = uVar11 >> 0xc;
        uVar8 = uVar8 >> 0xc | uVar11 << 0x34;
        uVar13 = local_90 << 0x34 | uVar10 >> 0xc;
      }
      else {
        uVar12 = 0xffffffffffffffff;
        if (uVar11 < uVar15) {
          uVar2 = local_a8 >> 0x20;
          uVar5 = 0xffffffff00000000;
          local_a8 = uVar13 & 0xffffffff00000000 | 0x8000000000000000;
          if (uVar11 < local_a8) {
            uVar5 = uVar11 / uVar2 << 0x20;
          }
          uVar18 = (uVar15 & 0xffffffff) * (uVar5 >> 0x20);
          uVar12 = uVar5 * uVar15;
          uVar13 = uVar8 - uVar12;
          lVar6 = ((uVar11 - ((uVar18 >> 0x20) + (uVar5 >> 0x20) * uVar2)) - (ulong)(uVar8 < uVar12)
                  ) - (ulong)(uVar12 < uVar18 << 0x20);
          if (lVar6 < 0) {
            uVar12 = (0x100000000 - uVar5) * uVar15 + uVar8;
            uVar18 = uVar13;
            do {
              uVar5 = uVar5 - 0x100000000;
              uVar13 = uVar18 + (uVar15 << 0x20);
              bVar19 = uVar12 < uVar18;
              uVar12 = uVar12 + (uVar15 << 0x20);
              lVar6 = lVar6 + uVar2 + (ulong)bVar19;
              uVar18 = uVar13;
            } while (lVar6 < 0);
          }
          uVar12 = uVar13 >> 0x20 | lVar6 << 0x20;
          if (uVar12 < local_a8) {
            uVar12 = uVar12 / uVar2;
          }
          else {
            uVar12 = 0xffffffff;
          }
          uVar12 = uVar12 | uVar5;
          local_a0 = uVar10;
        }
        uVar5 = 0;
        if (3 < uVar12) {
          uVar5 = uVar12 - 4;
        }
        cVar4 = (char)uVar16;
        uVar5 = uVar5 >> (-cVar4 & 0x3fU);
        uVar13 = local_90 << 0x34 | uVar10 >> 0xc;
        bVar3 = (byte)(uVar16 + 0x34);
        if ((int)uVar16 < -0x34) {
          uVar12 = uVar8 >> (-cVar4 - 0x34U & 0x3f) | uVar11 << (bVar3 & 0x3f);
          uVar11 = uVar11 >> (-cVar4 - 0x34U & 0x3f);
        }
        else {
          uVar12 = uVar8 << (bVar3 & 0x3f);
          if (uVar16 + 0x34 != 0) {
            uVar11 = uVar11 << (bVar3 & 0x3f) | uVar8 >> (0xcU - cVar4 & 0x3f);
          }
        }
        uVar8 = (uVar10 >> 0xc & 0xffffffff) * (uVar5 >> 0x20);
        uVar10 = (uVar5 & 0xffffffff) * (uVar13 >> 0x20);
        lVar6 = 0;
        uVar2 = uVar10 + uVar8;
        if (CARRY8(uVar10,uVar8)) {
          lVar6 = -0x100000000;
        }
        uVar10 = uVar5 * uVar13;
        uVar8 = uVar12 - uVar10;
        uVar14 = (((lVar6 - ((uVar5 >> 0x20) * (uVar13 >> 0x20) + uVar5 * (uVar15 >> 0xc) +
                            (uVar2 >> 0x20))) - (ulong)(uVar10 < uVar2 << 0x20)) + uVar11) -
                 (ulong)(uVar12 < uVar10);
      }
      zSig1 = uVar8 + uVar13;
      uVar11 = uVar8 * 2 + uVar13;
      uVar5 = uVar5 - 1;
      do {
        zSig0 = uVar14;
        uVar11 = uVar11 + uVar13 * -2;
        zSig1 = zSig1 - uVar13;
        uVar5 = uVar5 + 1;
        bVar19 = uVar8 < uVar13;
        uVar8 = uVar8 - uVar13;
        uVar14 = (zSig0 - (uVar15 >> 0xc)) - (ulong)bVar19;
      } while (-1 < (long)uVar14);
      lVar6 = uVar14 + zSig0 + (ulong)(uVar11 < uVar8);
      if (((-1 < lVar6) && ((uVar5 & 1) != 0 || (lVar6 != 0 || uVar11 != 0))) ||
         (uVar14 = zSig0, uVar8 = zSig1, (long)zSig0 < 0)) {
        zSig1 = -uVar8;
        zSig0 = -uVar14 - (ulong)(uVar8 != 0);
      }
      local_88 = status;
      local_58 = a.high;
      a = normalizeRoundAndPackFloat128
                    ((byte)((byte)(uVar14 >> 0x38) ^ a.high._7_1_) >> 7,local_ac - 4,zSig0,zSig1,
                     status);
    }
  }
  return a;
}

Assistant:

float128 float128_rem(float128 a, float128 b, float_status *status)
{
    flag aSign, zSign;
    int32_t aExp, bExp, expDiff;
    uint64_t aSig0, aSig1, bSig0, bSig1, q, term0, term1, term2;
    uint64_t allZero, alternateASig0, alternateASig1, sigMean1;
    int64_t sigMean0;

    aSig1 = extractFloat128Frac1( a );
    aSig0 = extractFloat128Frac0( a );
    aExp = extractFloat128Exp( a );
    aSign = extractFloat128Sign( a );
    bSig1 = extractFloat128Frac1( b );
    bSig0 = extractFloat128Frac0( b );
    bExp = extractFloat128Exp( b );
    if ( aExp == 0x7FFF ) {
        if (    ( aSig0 | aSig1 )
             || ( ( bExp == 0x7FFF ) && ( bSig0 | bSig1 ) ) ) {
            return propagateFloat128NaN(a, b, status);
        }
        goto invalid;
    }
    if ( bExp == 0x7FFF ) {
        if (bSig0 | bSig1) {
            return propagateFloat128NaN(a, b, status);
        }
        return a;
    }
    if ( bExp == 0 ) {
        if ( ( bSig0 | bSig1 ) == 0 ) {
 invalid:
            float_raise(float_flag_invalid, status);
            return float128_default_nan(status);
        }
        normalizeFloat128Subnormal( bSig0, bSig1, &bExp, &bSig0, &bSig1 );
    }
    if ( aExp == 0 ) {
        if ( ( aSig0 | aSig1 ) == 0 ) return a;
        normalizeFloat128Subnormal( aSig0, aSig1, &aExp, &aSig0, &aSig1 );
    }
    expDiff = aExp - bExp;
    if ( expDiff < -1 ) return a;
    shortShift128Left(
        aSig0 | UINT64_C(0x0001000000000000),
        aSig1,
        15 - ( expDiff < 0 ),
        &aSig0,
        &aSig1
    );
    shortShift128Left(
        bSig0 | UINT64_C(0x0001000000000000), bSig1, 15, &bSig0, &bSig1 );
    q = le128( bSig0, bSig1, aSig0, aSig1 );
    if ( q ) sub128( aSig0, aSig1, bSig0, bSig1, &aSig0, &aSig1 );
    expDiff -= 64;
    while ( 0 < expDiff ) {
        q = estimateDiv128To64( aSig0, aSig1, bSig0 );
        q = ( 4 < q ) ? q - 4 : 0;
        mul128By64To192( bSig0, bSig1, q, &term0, &term1, &term2 );
        shortShift192Left( term0, term1, term2, 61, &term1, &term2, &allZero );
        shortShift128Left( aSig0, aSig1, 61, &aSig0, &allZero );
        sub128( aSig0, 0, term1, term2, &aSig0, &aSig1 );
        expDiff -= 61;
    }
    if ( -64 < expDiff ) {
        q = estimateDiv128To64( aSig0, aSig1, bSig0 );
        q = ( 4 < q ) ? q - 4 : 0;
        q >>= - expDiff;
        shift128Right( bSig0, bSig1, 12, &bSig0, &bSig1 );
        expDiff += 52;
        if ( expDiff < 0 ) {
            shift128Right( aSig0, aSig1, - expDiff, &aSig0, &aSig1 );
        }
        else {
            shortShift128Left( aSig0, aSig1, expDiff, &aSig0, &aSig1 );
        }
        mul128By64To192( bSig0, bSig1, q, &term0, &term1, &term2 );
        sub128( aSig0, aSig1, term1, term2, &aSig0, &aSig1 );
    }
    else {
        shift128Right( aSig0, aSig1, 12, &aSig0, &aSig1 );
        shift128Right( bSig0, bSig1, 12, &bSig0, &bSig1 );
    }
    do {
        alternateASig0 = aSig0;
        alternateASig1 = aSig1;
        ++q;
        sub128( aSig0, aSig1, bSig0, bSig1, &aSig0, &aSig1 );
    } while ( 0 <= (int64_t) aSig0 );
    add128(
        aSig0, aSig1, alternateASig0, alternateASig1, (uint64_t *)&sigMean0, &sigMean1 );
    if (    ( sigMean0 < 0 )
         || ( ( ( sigMean0 | sigMean1 ) == 0 ) && ( q & 1 ) ) ) {
        aSig0 = alternateASig0;
        aSig1 = alternateASig1;
    }
    zSign = ( (int64_t) aSig0 < 0 );
    if ( zSign ) sub128( 0, 0, aSig0, aSig1, &aSig0, &aSig1 );
    return normalizeRoundAndPackFloat128(aSign ^ zSign, bExp - 4, aSig0, aSig1,
                                         status);
}